

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.cpp
# Opt level: O1

void __thiscall RVO::KdTree::buildObstacleTree(KdTree *this)

{
  ulong uVar1;
  ObstacleTreeNode *pOVar2;
  pointer ppOVar3;
  vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_> obstacles;
  allocator_type local_21;
  vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_> local_20;
  
  deleteObstacleTree(this,this->obstacleTree_);
  std::vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>::vector
            (&local_20,
             (long)(this->sim_->obstacles_).
                   super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->sim_->obstacles_).
                   super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,&local_21);
  ppOVar3 = (this->sim_->obstacles_).
            super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->sim_->obstacles_).super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppOVar3) {
    uVar1 = 0;
    do {
      local_20.super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar1] = ppOVar3[uVar1];
      uVar1 = uVar1 + 1;
      ppOVar3 = (this->sim_->obstacles_).
                super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar1 < (ulong)((long)(this->sim_->obstacles_).
                                   super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar3 >> 3))
    ;
  }
  pOVar2 = buildObstacleTreeRecursive(this,&local_20);
  this->obstacleTree_ = pOVar2;
  if (local_20.super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_20.super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_20.
                          super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_20.
                          super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void KdTree::buildObstacleTree()
	{
		deleteObstacleTree(obstacleTree_);

		std::vector<Obstacle *> obstacles(sim_->obstacles_.size());

		for (size_t i = 0; i < sim_->obstacles_.size(); ++i) {
			obstacles[i] = sim_->obstacles_[i];
		}

		obstacleTree_ = buildObstacleTreeRecursive(obstacles);
	}